

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int doDeinit(void)

{
  __PHYSFS_DIRHANDLE__ *p_Var1;
  __PHYSFS_ERRSTATETYPE__ *p_Var2;
  ErrState *pEVar3;
  int iVar4;
  int iVar5;
  DirHandle *dh;
  
  closeFileHandleList(&openWriteList);
  iVar5 = 0;
  iVar4 = PHYSFS_setWriteDir((char *)0x0);
  if (iVar4 == 0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_FILES_STILL_OPEN);
  }
  else {
    closeFileHandleList(&openReadList);
    dh = searchPath;
    if (searchPath != (DirHandle *)0x0) {
      do {
        p_Var1 = dh->next;
        freeDirHandle(dh,openReadList);
        dh = p_Var1;
      } while (p_Var1 != (__PHYSFS_DIRHANDLE__ *)0x0);
      searchPath = (DirHandle *)0x0;
    }
    while (numArchivers != 0) {
      iVar4 = doDeregisterArchiver(numArchivers - 1);
      if (iVar4 == 0) {
        __assert_fail("!\"nothing should be mounted during shutdown.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                      ,0x544,"void freeArchivers(void)");
      }
    }
    (*__PHYSFS_AllocatorHooks.Free)(archivers);
    (*__PHYSFS_AllocatorHooks.Free)(archiveInfo);
    archivers = (PHYSFS_Archiver **)0x0;
    archiveInfo = (PHYSFS_ArchiveInfo **)0x0;
    pEVar3 = errorStates;
    while (pEVar3 != (ErrState *)0x0) {
      p_Var2 = pEVar3->next;
      (*__PHYSFS_AllocatorHooks.Free)(pEVar3);
      pEVar3 = p_Var2;
    }
    errorStates = (ErrState *)0x0;
    if (baseDir != (char *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(baseDir);
      baseDir = (char *)0x0;
    }
    if (userDir != (char *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(userDir);
      userDir = (char *)0x0;
    }
    if (prefDir != (char *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(prefDir);
      prefDir = (char *)0x0;
    }
    if (archiveInfo != (PHYSFS_ArchiveInfo **)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(archiveInfo);
      archiveInfo = (PHYSFS_ArchiveInfo **)0x0;
    }
    if (archivers != (PHYSFS_Archiver **)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(archivers);
      archivers = (PHYSFS_Archiver **)0x0;
    }
    longest_root = 0;
    allowSymLinks = 0;
    initialized = 0;
    if (errorLock != (void *)0x0) {
      __PHYSFS_platformDestroyMutex(errorLock);
    }
    if (stateLock != (void *)0x0) {
      __PHYSFS_platformDestroyMutex(stateLock);
    }
    if (__PHYSFS_AllocatorHooks.Deinit != (_func_void *)0x0) {
      (*__PHYSFS_AllocatorHooks.Deinit)();
    }
    stateLock = (void *)0x0;
    errorLock = (void *)0x0;
    __PHYSFS_platformDeinit();
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int doDeinit(void)
{
    closeFileHandleList(&openWriteList);
    BAIL_IF(!PHYSFS_setWriteDir(NULL), PHYSFS_ERR_FILES_STILL_OPEN, 0);

    freeSearchPath();
    freeArchivers();
    freeErrorStates();

    if (baseDir != NULL)
    {
        allocator.Free(baseDir);
        baseDir = NULL;
    } /* if */

    if (userDir != NULL)
    {
        allocator.Free(userDir);
        userDir = NULL;
    } /* if */

    if (prefDir != NULL)
    {
        allocator.Free(prefDir);
        prefDir = NULL;
    } /* if */

    if (archiveInfo != NULL)
    {
        allocator.Free(archiveInfo);
        archiveInfo = NULL;
    } /* if */

    if (archivers != NULL)
    {
        allocator.Free(archivers);
        archivers = NULL;
    } /* if */

    longest_root = 0;
    allowSymLinks = 0;
    initialized = 0;

    if (errorLock) __PHYSFS_platformDestroyMutex(errorLock);
    if (stateLock) __PHYSFS_platformDestroyMutex(stateLock);

    if (allocator.Deinit != NULL)
        allocator.Deinit();

    errorLock = stateLock = NULL;

    __PHYSFS_platformDeinit();

    return 1;
}